

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPAddressTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::net::IPAddress_testResolveAddress_Test::TestBody
          (IPAddress_testResolveAddress_Test *this)

{
  char cVar1;
  allocator local_b0 [8];
  string local_a8 [32];
  unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter> local_88;
  unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter> local_60;
  unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter> local_38;
  
  cVar1 = testing::internal::AlwaysTrue();
  if (cVar1 == '\0') {
    testing::Message::Message((Message *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/IPAddressTest.cpp"
               ,0x2b,
               "Expected: resolveAddress(\"localhost\", 80, 2, SOCK_STREAM) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_a8);
  }
  else {
    cVar1 = testing::internal::AlwaysTrue();
    if (cVar1 != '\0') {
      std::__cxx11::string::string(local_a8,"localhost",local_b0);
      jaegertracing::net::resolveAddress((string *)&local_38,(int)local_a8,0x50,2);
      std::unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter>::~unique_ptr(&local_38);
      std::__cxx11::string::~string(local_a8);
    }
    cVar1 = testing::internal::AlwaysTrue();
    if (cVar1 == '\0') {
      testing::Message::Message((Message *)local_a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/IPAddressTest.cpp"
                 ,0x30,
                 "Expected: resolveAddress(\"123456\", 80, 2, SOCK_STREAM) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_a8);
    }
    else {
      cVar1 = testing::internal::AlwaysTrue();
      if (cVar1 != '\0') {
        std::__cxx11::string::string(local_a8,"123456",local_b0);
        jaegertracing::net::resolveAddress((string *)&local_60,(int)local_a8,0x50,2);
        std::unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter>::~unique_ptr(&local_60);
        std::__cxx11::string::~string(local_a8);
      }
      cVar1 = testing::internal::AlwaysTrue();
      if (cVar1 != '\0') {
        std::__cxx11::string::string(local_a8,"localhost",local_b0);
        jaegertracing::net::resolveAddress((string *)&local_88,(int)local_a8,0x50,-1);
        std::unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter>::~unique_ptr(&local_88);
        std::__cxx11::string::~string(local_a8);
      }
      testing::Message::Message((Message *)local_a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/IPAddressTest.cpp"
                 ,0x32,
                 "Expected: resolveAddress(\"localhost\", 80, -1) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_a8);
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_a8);
  return;
}

Assistant:

TEST(IPAddress, testResolveAddress)
{
    ASSERT_NO_THROW(resolveAddress("localhost", 80, AF_INET, SOCK_STREAM));
#ifdef WIN32
    ASSERT_THROW(resolveAddress("123456", 80, AF_INET, SOCK_STREAM),
                 std::runtime_error);
#else
    ASSERT_NO_THROW(resolveAddress("123456", 80, AF_INET, SOCK_STREAM));
#endif
    ASSERT_THROW(resolveAddress("localhost", 80, -1), std::runtime_error);
}